

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Detonation_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::LE_Detonation_PDU::SetEventID(LE_Detonation_PDU *this,LE_EntityIdentifier *ID)

{
  LE_EntityIdentifier *this_00;
  KUINT16 *pKVar1;
  KUINT16 KVar2;
  KUINT8 KVar3;
  KUINT8 KVar4;
  short sVar5;
  
  SetEventNumberIncludedFlag(this,true);
  KVar3 = ID->m_ui8ApplicationID;
  KVar2 = ID->m_ui16EntityID;
  (this->m_EventID).m_ui8SiteID = ID->m_ui8SiteID;
  (this->m_EventID).m_ui8ApplicationID = KVar3;
  (this->m_EventID).m_ui16EntityID = KVar2;
  this_00 = &(this->super_LE_Header).m_EntID;
  KVar3 = DATA_TYPE::LE_EntityIdentifier::GetSiteID(this_00);
  KVar4 = DATA_TYPE::LE_EntityIdentifier::GetSiteID(ID);
  if (KVar3 == KVar4) {
    KVar3 = DATA_TYPE::LE_EntityIdentifier::GetApplicationID(this_00);
    KVar4 = DATA_TYPE::LE_EntityIdentifier::GetApplicationID(ID);
    if (KVar3 == KVar4) {
      if (((this->m_DetonationFlag1Union).m_ui8Flag & 8) == 0) {
        return;
      }
      (this->m_DetonationFlag1Union).m_ui8Flag = (this->m_DetonationFlag1Union).m_ui8Flag & 0xf7;
      sVar5 = -2;
      goto LAB_00155124;
    }
  }
  if (((this->m_DetonationFlag1Union).m_ui8Flag & 8) != 0) {
    return;
  }
  (this->m_DetonationFlag1Union).m_ui8Flag = (this->m_DetonationFlag1Union).m_ui8Flag | 8;
  sVar5 = 2;
LAB_00155124:
  pKVar1 = &(this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength;
  *pKVar1 = *pKVar1 + sVar5;
  return;
}

Assistant:

void LE_Detonation_PDU::SetEventID( const LE_EntityIdentifier & ID )
{
    SetEventNumberIncludedFlag( true );
    m_EventID = ID;

    // Check if the id's site and application values
    // are the same, if they are we don't include them.
    if( m_EntID.GetSiteID() == ID.GetSiteID() &&
            m_EntID.GetApplicationID() == ID.GetApplicationID() )
    {
        // They match so don't include the fields
        SetEventIDSiteAppIncludedFlag( false );
    }
    else
    {
        // They don't match so we need to send these fields.
        SetEventIDSiteAppIncludedFlag( true );
    }
}